

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

NodeId __thiscall anon_unknown.dwarf_d715c4::Scenario::NewPeer(Scenario *this)

{
  long lVar1;
  uint64_t uVar2;
  RandomMixin<FastRandomContext> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar3;
  bool ok;
  NodeId ret;
  value_type_conflict6 *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc4;
  RandomMixin<FastRandomContext> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  do {
    uVar2 = RandomMixin<FastRandomContext>::randbits(this_00,in_stack_ffffffffffffffc4);
    pVar3 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)in_RDI,
                       in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffc4 = CONCAT13(pVar3.second,(int3)in_stack_ffffffffffffffc4) & 0x1ffffff;
  } while ((((byte)(in_stack_ffffffffffffffc4 >> 0x18) ^ 0xff) & 1) != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

NodeId NewPeer()
    {
        bool ok;
        NodeId ret;
        do {
            ret = m_rng.randbits(63);
            ok = m_runner.peerset.insert(ret).second;
        } while(!ok);
        return ret;
    }